

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataVariable.h
# Opt level: O2

void __thiscall Rml::StructDefinition::~StructDefinition(StructDefinition *this)

{
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>
  ::~vector(&(this->members).m_container);
  operator_delete(this,0x28);
  return;
}

Assistant:

class RMLUICORE_API StructDefinition final : public VariableDefinition {
public:
	StructDefinition();

	DataVariable Child(void* ptr, const DataAddressEntry& address) override;

	void AddMember(const String& name, UniquePtr<VariableDefinition> member);

private:
	SmallUnorderedMap<String, UniquePtr<VariableDefinition>> members;
}